

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

void register_method_call(macro_interpreter_state *istate,uint32_t res)

{
  obj *poVar1;
  obj *obj;
  pushbuf_decode_state pstate;
  uint32_t res_local;
  macro_interpreter_state *istate_local;
  
  pstate.fifo._4_4_ = res;
  memset(&obj,0,0x30);
  poVar1 = istate->obj;
  if (istate->mthd < 0x20000) {
    poVar1->data[istate->mthd >> 2] = pstate.fifo._4_4_;
  }
  else {
    fprintf(_stdout,"method 0x%x >= 0x%x\n",(ulong)istate->mthd,0x20000);
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
  }
  if (macro_rt_verbose == 0) {
    fprintf(_stdout,"PM: 0x%08x   %s.%s = %s",(ulong)pstate.fifo._4_4_,dec_obj,dec_mthd,dec_val);
    pstate.next_command_offset = istate->mthd;
    pstate.mthd = pstate.fifo._4_4_;
    pstate._32_8_ = istate->device;
    if ((poVar1->decoder != (gpu_object_decoder *)0x0) &&
       (poVar1->decoder->decode_terse != (_func_void_gpu_object_ptr_pushbuf_decode_state_ptr *)0x0))
    {
      (*poVar1->decoder->decode_terse)(poVar1->gpu_object,(pushbuf_decode_state *)&obj);
    }
    fprintf(_stdout,"%s\n","");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    if ((poVar1->decoder != (gpu_object_decoder *)0x0) &&
       (poVar1->decoder->decode_verbose != (_func_void_gpu_object_ptr_pushbuf_decode_state_ptr *)0x0
       )) {
      (*poVar1->decoder->decode_verbose)(poVar1->gpu_object,(pushbuf_decode_state *)&obj);
    }
  }
  return;
}

Assistant:

static void register_method_call(struct macro_interpreter_state *istate, uint32_t res)
{
	struct pushbuf_decode_state pstate = { 0 };
	struct obj *obj = istate->obj;

	if (istate->mthd < OBJECT_SIZE)
		obj->data[istate->mthd / 4] = res;
	else
		mmt_printf("method 0x%x >= 0x%x\n", istate->mthd, OBJECT_SIZE);

	if (macro_rt_verbose)
		return;

	mmt_printf("PM: 0x%08x   %s.%s = %s", res, dec_obj, dec_mthd, dec_val);

	pstate.mthd = istate->mthd;
	pstate.mthd_data = res;
	pstate.fifo = istate->device;

	if (obj->decoder && obj->decoder->decode_terse)
		obj->decoder->decode_terse(obj->gpu_object, &pstate);
	mmt_printf("%s\n", "");

	if (obj->decoder && obj->decoder->decode_verbose)
		obj->decoder->decode_verbose(obj->gpu_object, &pstate);
}